

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_obj.c
# Opt level: O0

void * lj_obj_ptr(global_State *g,cTValue *o)

{
  cTValue *o_local;
  global_State *g_local;
  void *local_30;
  uint32_t *segmap;
  uint64_t seg;
  uint64_t u;
  
  if ((o->field_2).it == 0xfffffff3) {
    local_30 = (void *)((ulong)(o->u32).lo + 0x18);
  }
  else if ((int)(o->field_2).it >> 0xf == -2) {
    local_30 = (void *)((ulong)*(uint *)((ulong)(g->gc).lightudseg.ptr32 +
                                        (o->u64 >> 0x27 & 0xff) * 4) << 0x20 | o->u64 & 0x7fffffffff
                       );
  }
  else if ((o->field_2).it == 0xfffffff5) {
    local_30 = (void *)((ulong)(o->u32).lo + 8);
  }
  else if ((o->field_2).it + 4 < 0xfffffff7) {
    local_30 = (void *)0x0;
  }
  else {
    local_30 = (void *)(ulong)(o->u32).lo;
  }
  return local_30;
}

Assistant:

const void * LJ_FASTCALL lj_obj_ptr(global_State *g, cTValue *o)
{
  UNUSED(g);
  if (tvisudata(o))
    return uddata(udataV(o));
  else if (tvislightud(o))
    return lightudV(g, o);
  else if (LJ_HASFFI && tviscdata(o))
    return cdataptr(cdataV(o));
  else if (tvisgcv(o))
    return gcV(o);
  else
    return NULL;
}